

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::keyboardSearch(QAbstractItemView *this,QString *search)

{
  QPersistentModelIndex *this_00;
  long lVar1;
  long *plVar2;
  QArrayData *pQVar3;
  const_iterator __first1;
  long lVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  const_iterator cVar11;
  ulong uVar12;
  QArrayData *pQVar13;
  long in_FS_OFFSET;
  uint local_118;
  uint local_114;
  QAbstractItemModel *local_110;
  undefined1 *local_f8;
  QArrayData *local_d0;
  const_iterator cStack_c8;
  long local_c0;
  QModelIndex local_b8;
  QModelIndex local_98;
  QModelIndex local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  plVar2 = *(long **)(lVar1 + 0x2f8);
  this_00 = (QPersistentModelIndex *)(lVar1 + 0x3b8);
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
  iVar7 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_58);
  if (iVar7 == 0) goto LAB_005388fd;
  plVar2 = *(long **)(lVar1 + 0x2f8);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,this_00);
  iVar7 = (**(code **)(*plVar2 + 0x80))(plVar2,&local_78);
  if (iVar7 == 0) goto LAB_005388fd;
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex((QModelIndex *)&local_58,this);
  if ((((int)local_58._0_4_ < 0) || ((long)local_58.shared < 0)) ||
     ((long *)local_58._16_8_ == (long *)0x0)) {
    plVar2 = *(long **)(lVar1 + 0x2f8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
    (**(code **)(*plVar2 + 0x60))(&local_78,plVar2,0,0,&local_98);
  }
  else {
    currentIndex(&local_78,this);
  }
  cVar5 = QElapsedTimer::isValid();
  if (cVar5 == '\0') {
    QElapsedTimer::start();
LAB_0053837c:
    QString::operator=((QString *)(lVar1 + 0x3f0),(QString *)search);
    currentIndex((QModelIndex *)&local_58,this);
    bVar6 = false;
    if ((-1 < (int)local_58._0_4_) && (-1 < (long)local_58.shared)) {
      bVar6 = (long *)local_58._16_8_ != (long *)0x0;
    }
  }
  else {
    lVar10 = QElapsedTimer::restart();
    if (((search->d).size == 0) || (iVar7 = QApplication::keyboardInputInterval(), iVar7 < lVar10))
    goto LAB_0053837c;
    QString::append((QString *)(lVar1 + 0x3f0));
    bVar6 = false;
  }
  if (*(ulong *)(lVar1 + 0x400) < 2) {
    if (bVar6) goto LAB_00538417;
  }
  else {
    iVar7 = QString::count((QChar)(char16_t)(QString *)(lVar1 + 0x3f0),
                           (uint)*(ushort *)
                                  (*(long *)(lVar1 + 0x3f8) + -2 + *(ulong *)(lVar1 + 0x400) * 2));
    if ((long)iVar7 == *(long *)(lVar1 + 0x400) || bVar6) {
LAB_00538417:
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (local_78.m.ptr == (QAbstractItemModel *)0x0) {
        local_58._forAlignment = -NAN;
        local_58._8_8_ = (undefined1 *)0x0;
        local_58._16_8_ = (long *)0x0;
      }
      else {
        (**(code **)(*(long *)local_78.m.ptr + 0x68))(&local_58,local_78.m.ptr,&local_78);
      }
      iVar7 = local_78.r;
      iVar8 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x78))(*(long **)(lVar1 + 0x2f8),&local_58);
      iVar9 = 0;
      if (iVar7 < iVar8 + -1) {
        iVar9 = local_78.r + 1;
      }
      (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x60))
                (&local_98,*(long **)(lVar1 + 0x2f8),iVar9,local_78.c,&local_58);
      local_78.m.ptr = local_98.m.ptr;
      local_78.r = local_98.r;
      local_78.c = local_98.c;
      local_78.i = local_98.i;
    }
  }
  local_98.m.ptr = local_78.m.ptr;
  local_98.r = local_78.r;
  local_98.c = local_78.c;
  local_98.i = local_78.i;
  local_b8._0_8_ = (PrivateShared *)0xffffffffffffffff;
  local_b8.i = 0;
  local_b8.m.ptr = (QAbstractItemModel *)0x0;
  local_118 = 0xffffffff;
  local_f8 = (undefined1 *)0x0;
  local_110 = (QAbstractItemModel *)0x0;
  local_114 = 0xffffffff;
  cVar11.i = (QModelIndex *)0x0;
  pQVar13 = (QArrayData *)0x0;
  lVar10 = 0;
LAB_00538538:
  plVar2 = *(long **)(lVar1 + 0x2f8);
  ::QVariant::QVariant((QVariant *)&local_58,(QString *)(lVar1 + 0x3f0));
  (**(code **)(*plVar2 + 0x150))(&local_d0,plVar2,&local_98,0,&local_58,1,0x22);
  lVar4 = local_c0;
  __first1.i = cStack_c8.i;
  pQVar3 = local_d0;
  local_d0 = (QArrayData *)0x0;
  cStack_c8.i = (QModelIndex *)0x0;
  local_c0 = 0;
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,0x18,0x10);
    }
  }
  if (local_d0 != (QArrayData *)0x0) {
    LOCK();
    (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d0,0x18,0x10);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if ((lVar4 == lVar10) &&
     ((__first1.i == cVar11.i ||
      (bVar6 = std::__equal<false>::
               equal<QList<QModelIndex>::const_iterator,QList<QModelIndex>::const_iterator>
                         (__first1,__first1.i + lVar10,cVar11), bVar6)))) goto LAB_005388c2;
  local_58._forAlignment = -NAN;
  local_58._8_8_ = (undefined1 *)0x0;
  local_58._16_8_ = (long *)0x0;
  cVar11.i = __first1.i;
  if (lVar4 == 0) {
    cVar11.i = (QModelIndex *)&local_58;
  }
  local_b8.m.ptr = *(QAbstractItemModel **)((long)cVar11.i + 0x10);
  local_b8._0_8_ = *(undefined8 *)cVar11.i;
  local_b8.i = *(quintptr *)((long)cVar11.i + 8);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,0x18,0x10);
    }
  }
  pQVar13 = pQVar3;
  if (local_b8.m.ptr != (QAbstractItemModel *)0x0 && -1 < (local_b8.r | local_b8.c)) {
    uVar12 = (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x138))(*(long **)(lVar1 + 0x2f8),&local_b8);
    if ((uVar12 & 0x20) != 0) {
      setCurrentIndex(this,&local_b8);
LAB_005388c2:
      if (pQVar13 != (QArrayData *)0x0) {
        LOCK();
        (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar13,0x18,0x10);
        }
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,0x18,0x10);
        }
      }
LAB_005388fd:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    iVar7 = local_b8.r;
    plVar2 = *(long **)(lVar1 + 0x2f8);
    if (local_b8.m.ptr == (QAbstractItemModel *)0x0) {
      local_58._forAlignment = -NAN;
      local_58._8_8_ = (undefined1 *)0x0;
      local_58._16_8_ = (long *)0x0;
    }
    else {
      (**(code **)(*(long *)local_b8.m.ptr + 0x68))(&local_58,local_b8.m.ptr,&local_b8);
    }
    iVar7 = iVar7 + 1;
    iVar9 = (**(code **)(*plVar2 + 0x78))(plVar2,&local_58);
    if (iVar9 <= iVar7) {
      iVar7 = 0;
    }
    if (local_b8.m.ptr == (QAbstractItemModel *)0x0) {
      local_58._forAlignment = -NAN;
      local_58._8_8_ = (undefined1 *)0x0;
      local_58._16_8_ = (long *)0x0;
    }
    else if (local_b8.r == iVar7) {
      local_58._16_8_ = local_b8.m.ptr;
      local_58._0_4_ = local_b8.r;
      local_58._4_4_ = local_b8.c;
      local_58._8_8_ = local_b8.i;
    }
    else {
      (**(code **)(*(long *)local_b8.m.ptr + 0x70))
                (&local_58,local_b8.m.ptr,iVar7,local_b8.c,&local_b8);
    }
    local_98.m.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_98.r = local_58._0_4_;
    local_98.c = local_58._4_4_;
    local_98.i = local_58._8_8_;
    if ((int)(local_114 | local_118) < 0 || local_110 == (QAbstractItemModel *)0x0) {
      local_f8 = (undefined1 *)local_b8.i;
      local_110 = local_b8.m.ptr;
      local_118 = local_b8.c;
      local_114 = local_b8.r;
    }
    else if ((((local_114 == local_b8.r) && (local_118 == local_b8.c)) &&
             (local_f8 == (undefined1 *)local_b8.i)) && (local_110 == local_b8.m.ptr))
    goto LAB_005388c2;
  }
  if (local_98.r == local_78.r) {
    if (((local_98.c == local_78.c) && (local_98.i == local_78.i)) &&
       (local_98.m.ptr == local_78.m.ptr)) goto LAB_005388c2;
  }
  if (((local_b8.r < 0) || (local_b8.c < 0)) ||
     (cVar11.i = __first1.i, lVar10 = lVar4, local_b8.m.ptr == (QAbstractItemModel *)0x0))
  goto LAB_005388c2;
  goto LAB_00538538;
}

Assistant:

void QAbstractItemView::keyboardSearch(const QString &search)
{
    Q_D(QAbstractItemView);
    if (!d->model->rowCount(d->root) || !d->model->columnCount(d->root))
        return;

    QModelIndex start = currentIndex().isValid() ? currentIndex()
                        : d->model->index(0, 0, d->root);
    bool skipRow = false;
    bool keyboardTimeWasValid = d->keyboardInputTime.isValid();
    qint64 keyboardInputTimeElapsed;
    if (keyboardTimeWasValid)
        keyboardInputTimeElapsed = d->keyboardInputTime.restart();
    else
        d->keyboardInputTime.start();
    if (search.isEmpty() || !keyboardTimeWasValid
        || keyboardInputTimeElapsed > QApplication::keyboardInputInterval()) {
        d->keyboardInput = search;
        skipRow = currentIndex().isValid(); //if it is not valid we should really start at QModelIndex(0,0)
    } else {
        d->keyboardInput += search;
    }

    // special case for searches with same key like 'aaaaa'
    bool sameKey = false;
    if (d->keyboardInput.size() > 1) {
        int c = d->keyboardInput.count(d->keyboardInput.at(d->keyboardInput.size() - 1));
        sameKey = (c == d->keyboardInput.size());
        if (sameKey)
            skipRow = true;
    }

    // skip if we are searching for the same key or a new search started
    if (skipRow) {
        QModelIndex parent = start.parent();
        int newRow = (start.row() < d->model->rowCount(parent) - 1) ? start.row() + 1 : 0;
        start = d->model->index(newRow, start.column(), parent);
    }

    // search from start with wraparound
    QModelIndex current = start;
    QModelIndexList match;
    QModelIndex firstMatch;
    QModelIndex startMatch;
    QModelIndexList previous;
    do {
        match = d->model->match(current, Qt::DisplayRole, d->keyboardInput);
        if (match == previous)
            break;
        firstMatch = match.value(0);
        previous = match;
        if (firstMatch.isValid()) {
            if (d->isIndexEnabled(firstMatch)) {
                setCurrentIndex(firstMatch);
                break;
            }
            int row = firstMatch.row() + 1;
            if (row >= d->model->rowCount(firstMatch.parent()))
                row = 0;
            current = firstMatch.sibling(row, firstMatch.column());

            //avoid infinite loop if all the matching items are disabled.
            if (!startMatch.isValid())
                startMatch = firstMatch;
            else if (startMatch == firstMatch)
                break;
        }
    } while (current != start && firstMatch.isValid());
}